

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimemagicrule.cpp
# Opt level: O1

void __thiscall
QMimeMagicRule::QMimeMagicRule
          (QMimeMagicRule *this,QString *type,QByteArray *value,QString *offsets,QByteArray *mask,
          QString *errorString)

{
  QByteArray *this_00;
  QByteArray *this_01;
  Type *this_02;
  ArrayOptions *pAVar1;
  byte bVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  long lVar5;
  QString *pQVar6;
  qsizetype qVar7;
  qsizetype qVar8;
  char cVar9;
  bool bVar10;
  Type TVar11;
  CutResult CVar12;
  uint uVar13;
  uint uVar14;
  Data *pDVar15;
  code *pcVar16;
  byte *pbVar17;
  char *pcVar18;
  byte *pbVar19;
  byte *pbVar20;
  byte *pbVar21;
  byte *extraout_RDX;
  char16_t *pcVar22;
  byte bVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  char16_t *pcVar28;
  byte *pbVar29;
  QArrayData *pQVar30;
  Data *pDVar31;
  long in_FS_OFFSET;
  QByteArrayView needle;
  QStringView n;
  QStringView n_00;
  QByteArrayView haystack;
  bool ok;
  QString local_a8;
  QString local_88;
  QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String> local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_subMatches).d.d = (Data *)0x0;
  (this->m_subMatches).d.ptr = (QMimeMagicRule *)0x0;
  (this->m_subMatches).d.size = 0;
  QString::toLatin1_helper((QByteArray *)&local_68,type);
  TVar11 = QMimeMagicRule::type((QByteArray *)&local_68);
  if ((QArrayData *)local_68.a.a.m_size != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68.a.a.m_size)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68.a.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68.a.a.m_size)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,1,0x10);
    }
  }
  this->m_type = TVar11;
  pDVar3 = (value->d).d;
  (this->m_value).d.d = pDVar3;
  (this->m_value).d.ptr = (value->d).ptr;
  (this->m_value).d.size = (value->d).size;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pDVar3 = (mask->d).d;
  (this->m_mask).d.d = pDVar3;
  (this->m_mask).d.ptr = (mask->d).ptr;
  (this->m_mask).d.size = (mask->d).size;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this_00 = &this->m_mask;
  this_01 = &this->m_pattern;
  (this->m_pattern).d.d = (Data *)0x0;
  (this->m_pattern).d.ptr = (char *)0x0;
  (this->m_pattern).d.size = 0;
  this->m_matchFunction = 0;
  *(undefined8 *)&this->field_0x80 = 0;
  if (this->m_type == Invalid) {
    if (errorString == (QString *)0x0) goto switchD_004b6c9f_default;
    local_68.a.a.m_size = 5;
    local_68.a.a.m_data = "Type ";
    local_68.b.m_size = 0x11;
    local_68.b.m_data = " is not supported";
    local_68.a.b = type;
    QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String>::
    convertTo<QString>(&local_88,&local_68);
LAB_004b71e5:
    pQVar30 = &((errorString->d).d)->super_QArrayData;
    pcVar22 = (errorString->d).ptr;
    (errorString->d).d = local_88.d.d;
    (errorString->d).ptr = local_88.d.ptr;
    qVar7 = (errorString->d).size;
    (errorString->d).size = local_88.d.size;
    local_88.d.d = (Data *)pQVar30;
    local_88.d.ptr = pcVar22;
    local_88.d.size = qVar7;
    if (pQVar30 != (QArrayData *)0x0) {
      LOCK();
      (pQVar30->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar30->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar30->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar30,2,0x10);
      }
    }
    goto switchD_004b6c9f_default;
  }
  pDVar15 = (Data *)QString::indexOf(offsets,(QChar)0x3a,0,CaseSensitive);
  pcVar28 = (offsets->d).ptr;
  local_68.a.a.m_size = 0;
  local_88.d.d = pDVar15;
  CVar12 = QtPrivate::QContainerImplHelper::mid
                     ((offsets->d).size,(qsizetype *)&local_68,(qsizetype *)&local_88);
  pcVar22 = (char16_t *)0x0;
  pDVar31 = (Data *)0x0;
  if (CVar12 != Null) {
    pcVar22 = pcVar28 + local_68.a.a.m_size;
    pDVar31 = local_88.d.d;
  }
  pcVar4 = (offsets->d).ptr;
  local_68.a.a.m_size =
       (long)&(pDVar15->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
  local_88.d.d = (Data *)0xffffffffffffffff;
  CVar12 = QtPrivate::QContainerImplHelper::mid
                     ((offsets->d).size,(qsizetype *)&local_68,(qsizetype *)&local_88);
  pcVar28 = (char16_t *)0x0;
  pQVar30 = (QArrayData *)0x0;
  if (CVar12 != Null) {
    pcVar28 = pcVar4 + local_68.a.a.m_size;
    pQVar30 = &(local_88.d.d)->super_QArrayData;
  }
  n.m_data = pcVar22;
  n.m_size = (qsizetype)pDVar31;
  bVar10 = QMimeTypeParserBase::parseNumber(n,&this->m_startPos,errorString);
  this_02 = &this->m_type;
  if ((!bVar10) ||
     (n_00.m_data = pcVar28, n_00.m_size = (qsizetype)pQVar30,
     bVar10 = QMimeTypeParserBase::parseNumber(n_00,&this->m_endPos,errorString), !bVar10)) {
    *this_02 = Invalid;
    goto switchD_004b6c9f_default;
  }
  if ((this->m_value).d.size == 0) {
    QMimeMagicRule((QMimeMagicRule *)this_02);
    goto switchD_004b6c9f_default;
  }
  if (*this_02 - Host16 < 7) {
    local_a8.d.d = (Data *)CONCAT71(local_a8.d.d._1_7_,0xaa);
    uVar13 = QByteArray::toUInt(&this->m_value,(bool *)&local_a8,0);
    this->m_number = uVar13;
    cVar9 = (char)local_a8.d.d;
    if ((char)local_a8.d.d == '\0') {
      *this_02 = Invalid;
      if (errorString != (QString *)0x0) {
        local_68.b.m_size = (qsizetype)(this->m_value).d.ptr;
        local_68.a.b = (QString *)(this->m_value).d.size;
        local_68.a.a.m_size = 0x1a;
        local_68.a.a.m_data = "Invalid magic rule value \"";
        local_68.b.m_data = (char *)CONCAT62(local_68.b.m_data._2_6_,0x22);
        QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t>::convertTo<QString>
                  (&local_88,
                   (QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t> *)
                   &local_68);
        pQVar30 = &((errorString->d).d)->super_QArrayData;
        pcVar22 = (errorString->d).ptr;
        (errorString->d).d = local_88.d.d;
        (errorString->d).ptr = local_88.d.ptr;
        qVar7 = (errorString->d).size;
        (errorString->d).size = local_88.d.size;
        local_88.d.d = (Data *)pQVar30;
        local_88.d.ptr = pcVar22;
        local_88.d.size = qVar7;
        if (pQVar30 != (QArrayData *)0x0) {
          LOCK();
          (pQVar30->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar30->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar30->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar30,2,0x10);
          }
        }
      }
    }
    else {
      if ((this->m_mask).d.size == 0) {
        uVar13 = 0;
      }
      else {
        uVar13 = QByteArray::toUInt(this_00,(bool *)&local_a8,0);
      }
      this->m_numberMask = uVar13;
    }
    if (cVar9 == '\0') goto switchD_004b6c9f_default;
  }
  TVar11 = *this_02;
  switch(TVar11) {
  case String:
    local_68.a.b = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.a.a.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.a.a.m_data = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)&local_68,(this->m_value).d.size,Uninitialized);
    if (((Data *)local_68.a.a.m_size == (Data *)0x0) ||
       (1 < (((QArrayData *)local_68.a.a.m_size)->ref_)._q_value.super___atomic_base<int>._M_i)) {
      QByteArray::reallocData((QByteArray *)&local_68,(qsizetype)local_68.a.b,KeepSize);
    }
    pcVar18 = (this->m_value).d.ptr;
    lVar5 = (this->m_value).d.size;
    if ((byte *)pcVar18 == (byte *)0x0) {
      pcVar18 = "";
    }
    pbVar29 = (byte *)local_68.a.a.m_data;
    if (lVar5 != 0) {
      pbVar17 = (byte *)pcVar18 + lVar5;
      do {
        pbVar20 = (byte *)pcVar18;
        if ((*pcVar18 == 0x5c) && (pbVar20 = (byte *)pcVar18 + 1, pbVar20 < pbVar17)) {
          bVar2 = *pbVar20;
          if (bVar2 == 0x78) {
            iVar27 = 0;
            bVar23 = 0;
            if ((byte *)pcVar18 + 2 < pbVar17) {
              uVar14 = 0;
              pbVar20 = (byte *)pcVar18 + 3;
              do {
                pbVar19 = pbVar20;
                iVar25 = (int)(char)pbVar19[-1];
                uVar26 = iVar25 - 0x30;
                if (9 < uVar26) {
                  if (iVar25 - 0x41U < 6) {
                    uVar26 = iVar25 - 0x37;
                  }
                  else {
                    uVar26 = iVar25 - 0x57;
                    if (5 < iVar25 - 0x61U) {
                      uVar26 = 0xffffffff;
                    }
                  }
                }
                uVar24 = uVar14 & 0xff;
                uVar14 = uVar24 * 0x10 + uVar26;
                if (uVar26 == 0xffffffff) {
                  uVar14 = uVar24;
                }
                bVar10 = iVar27 == 0;
                iVar27 = iVar27 + -1;
              } while ((bVar10) && (pbVar20 = pbVar19 + 1, pbVar19 < pbVar17));
              pbVar20 = pbVar19 + -1;
              bVar23 = (byte)uVar14;
            }
          }
          else if ((bVar2 & 0xf8) == 0x30) {
            bVar23 = bVar2 - 0x30;
            pbVar19 = (byte *)pcVar18 + 2;
            if ((pbVar19 < pbVar17) && ((*pbVar19 & 0xf8) == 0x30)) {
              bVar23 = (bVar23 * '\b' + *pbVar19) - 0x30;
              pbVar21 = (byte *)pcVar18 + 3;
              pbVar20 = pbVar19;
              if ((pbVar21 < pbVar17) && ((char)bVar2 < '4' && (*pbVar21 & 0xf8) == 0x30)) {
                pbVar20 = pbVar21;
                bVar23 = (bVar23 * '\b' + *pbVar21) - 0x30;
              }
            }
          }
          else if (bVar2 == 0x6e) {
            bVar23 = 10;
          }
          else if (bVar2 == 0x74) {
            bVar23 = 9;
          }
          else {
            bVar23 = bVar2;
            if (bVar2 == 0x72) {
              bVar23 = 0xd;
            }
          }
        }
        else {
          bVar23 = *pbVar20;
        }
        *pbVar29 = bVar23;
        pbVar29 = pbVar29 + 1;
        pcVar18 = (char *)(pbVar20 + 1);
      } while (pcVar18 < pbVar17);
    }
    if (((Data *)local_68.a.a.m_size == (Data *)0x0) ||
       (1 < (((QArrayData *)local_68.a.a.m_size)->ref_)._q_value.super___atomic_base<int>._M_i)) {
      QByteArray::reallocData((QByteArray *)&local_68,(qsizetype)local_68.a.b,KeepSize);
      pcVar18 = (char *)extraout_RDX;
    }
    QByteArray::truncate
              ((QByteArray *)&local_68,(char *)(pbVar29 + -(long)local_68.a.a.m_data),
               (__off_t)pcVar18);
    pQVar30 = &((this->m_pattern).d.d)->super_QArrayData;
    pcVar18 = (this->m_pattern).d.ptr;
    (this->m_pattern).d.d = (Data *)local_68.a.a.m_size;
    (this->m_pattern).d.ptr = local_68.a.a.m_data;
    pQVar6 = (QString *)(this->m_pattern).d.size;
    (this->m_pattern).d.size = (qsizetype)local_68.a.b;
    local_68.a.a.m_size = (qsizetype)pQVar30;
    local_68.a.a.m_data = pcVar18;
    local_68.a.b = pQVar6;
    if (pQVar30 != (QArrayData *)0x0) {
      LOCK();
      (pQVar30->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar30->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar30->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar30,1,0x10);
      }
    }
    pDVar3 = (this_01->d).d;
    if (pDVar3 != (Data *)0x0) {
      if ((1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         ((this->m_pattern).d.size < (pDVar3->super_QArrayData).alloc)) {
        QByteArray::reallocData(this_01,(this->m_pattern).d.size,KeepSize);
      }
      pDVar3 = (this_01->d).d;
      if ((pDVar3 != (Data *)0x0) && ((pDVar3->super_QArrayData).alloc != 0)) {
        pAVar1 = &(pDVar3->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i & 0xfe;
      }
    }
    pQVar6 = (QString *)(this->m_mask).d.size;
    if (pQVar6 != (QString *)0x0) {
      if ((QString *)0x3 < pQVar6) {
        pcVar18 = (this->m_mask).d.ptr;
        needle.m_data = "0x";
        needle.m_size = 2;
        haystack.m_data = pcVar18;
        haystack.m_size = (qsizetype)pQVar6;
        bVar10 = QtPrivate::startsWith(haystack,needle);
        if (bVar10) {
          if (pcVar18 == (char *)0x0) {
            pcVar18 = "";
          }
          local_68.a.a.m_data = pcVar18 + 2;
          local_68.a.b = (QString *)((long)&pQVar6[-1].d.size + 6);
          local_68.a.a.m_size = 0;
          QByteArray::fromHex((QByteArray *)&local_88,(QByteArray *)&local_68);
          if ((QArrayData *)local_68.a.a.m_size != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_68.a.a.m_size)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_68.a.a.m_size)->_q_value).super___atomic_base<int>._M_i
                 + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_68.a.a.m_size)->_q_value).super___atomic_base<int>._M_i
                == 0) {
              QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,1,0x10);
            }
          }
          qVar7 = local_88.d.size;
          lVar5 = (this->m_pattern).d.size;
          if (local_88.d.size == lVar5) {
            QByteArray::operator=(this_00,(QByteArray *)&local_88);
          }
          else {
            *this_02 = Invalid;
            if (errorString != (QString *)0x0) {
              local_68.b.m_size = (qsizetype)(this->m_mask).d.ptr;
              local_68.a.b = (QString *)(this->m_mask).d.size;
              local_68.a.a.m_size = 0x1e;
              local_68.a.a.m_data = "Invalid magic rule mask size \"";
              local_68.b.m_data = (char *)CONCAT62(local_68.b.m_data._2_6_,0x22);
              QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t>::
              convertTo<QString>(&local_a8,
                                 (QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t>
                                  *)&local_68);
              pQVar30 = &((errorString->d).d)->super_QArrayData;
              pcVar22 = (errorString->d).ptr;
              (errorString->d).d = local_a8.d.d;
              (errorString->d).ptr = local_a8.d.ptr;
              qVar8 = (errorString->d).size;
              (errorString->d).size = local_a8.d.size;
              local_a8.d.d = (Data *)pQVar30;
              local_a8.d.ptr = pcVar22;
              local_a8.d.size = qVar8;
              if (pQVar30 != (QArrayData *)0x0) {
                LOCK();
                (pQVar30->ref_)._q_value.super___atomic_base<int>._M_i =
                     (pQVar30->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pQVar30->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(pQVar30,2,0x10);
                }
              }
            }
          }
          if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
            }
          }
          if (qVar7 != lVar5) goto switchD_004b6c9f_default;
          goto LAB_004b712e;
        }
      }
      *this_02 = Invalid;
      if (errorString == (QString *)0x0) goto switchD_004b6c9f_default;
      local_68.b.m_size = (qsizetype)(this->m_mask).d.ptr;
      local_68.a.a.m_size = 0x19;
      local_68.a.a.m_data = "Invalid magic rule mask \"";
      local_68.b.m_data = (char *)CONCAT62(local_68.b.m_data._2_6_,0x22);
      local_68.a.b = pQVar6;
      QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t>::convertTo<QString>
                (&local_88,
                 (QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t> *)&local_68
                );
      goto LAB_004b71e5;
    }
    QByteArray::fill(this_00,-1,(this->m_pattern).d.size);
LAB_004b712e:
    pDVar3 = (this_00->d).d;
    if (pDVar3 != (Data *)0x0) {
      if ((1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         ((this->m_mask).d.size < (pDVar3->super_QArrayData).alloc)) {
        QByteArray::reallocData(this_00,(this->m_mask).d.size,KeepSize);
      }
      pDVar3 = (this_00->d).d;
      if ((pDVar3 != (Data *)0x0) && ((pDVar3->super_QArrayData).alloc != 0)) {
        pAVar1 = &(pDVar3->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i & 0xfe;
      }
    }
    pcVar16 = matchString;
    break;
  case Host16:
    goto switchD_004b6c9f_caseD_2;
  case Host32:
    goto switchD_004b6c9f_caseD_3;
  case Big16:
  case Little16:
    uVar14 = this->m_number;
    if (uVar14 < 0x10000) {
      uVar26 = (uint)(ushort)((ushort)uVar14 << 8 | (ushort)uVar14 >> 8);
      if (TVar11 == Little16) {
        uVar26 = uVar14;
      }
      this->m_number = uVar26 & 0xffff;
      uVar14 = this->m_numberMask;
      if (uVar14 != 0) {
        uVar26 = (uint)(ushort)((ushort)uVar14 << 8 | (ushort)uVar14 >> 8);
        if (TVar11 == Little16) {
          uVar26 = uVar14;
        }
        this->m_numberMask = uVar26 & 0xffff;
      }
    }
switchD_004b6c9f_caseD_2:
    if (0xffff < this->m_number) goto switchD_004b6c9f_default;
    if (this->m_numberMask == 0) {
      this->m_numberMask = 0xffff;
    }
    pcVar16 = matchNumber<unsigned_short>;
    break;
  case Big32:
  case Little32:
    uVar14 = this->m_number;
    uVar26 = this->m_numberMask;
    uVar24 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
    if (TVar11 == Little32) {
      uVar24 = uVar14;
    }
    this->m_number = uVar24;
    if (uVar26 != 0) {
      uVar14 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 | uVar26 << 0x18;
      if (TVar11 == Little32) {
        uVar14 = uVar26;
      }
      this->m_numberMask = uVar14;
    }
    goto switchD_004b6c9f_caseD_3;
  case Byte:
    if (0xff < this->m_number) goto switchD_004b6c9f_default;
    if (this->m_numberMask == 0) {
      this->m_numberMask = 0xff;
    }
    pcVar16 = matchNumber<unsigned_char>;
    break;
  default:
    goto switchD_004b6c9f_default;
  }
LAB_004b6d2f:
  this->m_matchFunction = (MatchFunction)pcVar16;
  *(undefined8 *)&this->field_0x80 = 0;
switchD_004b6c9f_default:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
switchD_004b6c9f_caseD_3:
  if (this->m_numberMask == 0) {
    this->m_numberMask = 0xffffffff;
  }
  pcVar16 = matchNumber<unsigned_int>;
  goto LAB_004b6d2f;
}

Assistant:

QMimeMagicRule::QMimeMagicRule(const QString &type,
                               const QByteArray &value,
                               const QString &offsets,
                               const QByteArray &mask,
                               QString *errorString)
    : m_type(QMimeMagicRule::type(type.toLatin1())),
      m_value(value),
      m_mask(mask),
      m_matchFunction(nullptr)
{
    if (Q_UNLIKELY(m_type == Invalid)) {
        if (errorString)
            *errorString = "Type "_L1 + type + " is not supported"_L1;
        return;
    }

    // Parse for offset as "1" or "1:10"
    const qsizetype colonIndex = offsets.indexOf(u':');
    const QStringView startPosStr = QStringView{offsets}.mid(0, colonIndex); // \ These decay to returning 'offsets'
    const QStringView endPosStr   = QStringView{offsets}.mid(colonIndex + 1);// / unchanged when colonIndex == -1
    if (Q_UNLIKELY(!QMimeTypeParserBase::parseNumber(startPosStr, &m_startPos, errorString)) ||
        Q_UNLIKELY(!QMimeTypeParserBase::parseNumber(endPosStr, &m_endPos, errorString))) {
        m_type = Invalid;
        return;
    }

    if (Q_UNLIKELY(m_value.isEmpty())) {
        m_type = Invalid;
        if (errorString)
            *errorString = QStringLiteral("Invalid empty magic rule value");
        return;
    }

    if (m_type >= Host16 && m_type <= Byte) {
        bool ok;
        m_number = m_value.toUInt(&ok, 0); // autodetect base
        if (Q_UNLIKELY(!ok)) {
            m_type = Invalid;
            if (errorString)
                *errorString = "Invalid magic rule value \""_L1 + QLatin1StringView(m_value) + u'"';
            return;
        }
        m_numberMask = !m_mask.isEmpty() ? m_mask.toUInt(&ok, 0) : 0; // autodetect base
    }

    switch (m_type) {
    case String:
        m_pattern = makePattern(m_value);
        m_pattern.squeeze();
        if (!m_mask.isEmpty()) {
            if (Q_UNLIKELY(m_mask.size() < 4 || !m_mask.startsWith("0x"))) {
                m_type = Invalid;
                if (errorString)
                    *errorString = "Invalid magic rule mask \""_L1 + QLatin1StringView(m_mask) + u'"';
                return;
            }
            const QByteArray &tempMask = QByteArray::fromHex(QByteArray::fromRawData(
                                                     m_mask.constData() + 2, m_mask.size() - 2));
            if (Q_UNLIKELY(tempMask.size() != m_pattern.size())) {
                m_type = Invalid;
                if (errorString)
                    *errorString = "Invalid magic rule mask size \""_L1 + QLatin1StringView(m_mask) + u'"';
                return;
            }
            m_mask = tempMask;
        } else {
            m_mask.fill(char(-1), m_pattern.size());
        }
        m_mask.squeeze();
        m_matchFunction = &QMimeMagicRule::matchString;
        break;
    case Byte:
        if (m_number <= quint8(-1)) {
            if (m_numberMask == 0)
                m_numberMask = quint8(-1);
            m_matchFunction = &QMimeMagicRule::matchNumber<quint8>;
        }
        break;
    case Big16:
    case Little16:
        if (m_number <= quint16(-1)) {
            m_number = m_type == Little16 ? qFromLittleEndian<quint16>(m_number) : qFromBigEndian<quint16>(m_number);
            if (m_numberMask != 0)
                m_numberMask = m_type == Little16 ? qFromLittleEndian<quint16>(m_numberMask) : qFromBigEndian<quint16>(m_numberMask);
        }
        Q_FALLTHROUGH();
    case Host16:
        if (m_number <= quint16(-1)) {
            if (m_numberMask == 0)
                m_numberMask = quint16(-1);
            m_matchFunction = &QMimeMagicRule::matchNumber<quint16>;
        }
        break;
    case Big32:
    case Little32:
        m_number = m_type == Little32 ? qFromLittleEndian<quint32>(m_number) : qFromBigEndian<quint32>(m_number);
        if (m_numberMask != 0)
            m_numberMask = m_type == Little32 ? qFromLittleEndian<quint32>(m_numberMask) : qFromBigEndian<quint32>(m_numberMask);
        Q_FALLTHROUGH();
    case Host32:
        if (m_numberMask == 0)
            m_numberMask = quint32(-1);
        m_matchFunction = &QMimeMagicRule::matchNumber<quint32>;
        break;
    default:
        break;
    }
}